

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Value *value;
  _Node_iterator_base<std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_false> _Var1;
  __node_type *extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_40 [32];
  
  local_40._0_8_ = *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + 0x40);
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<flow::lang::Symbol_*,_std::pair<flow::lang::Symbol_*const,_flow::Value_*>,_std::allocator<std::pair<flow::lang::Symbol_*const,_flow::Value_*>_>,_std::__detail::_Select1st,_std::equal_to<flow::lang::Symbol_*>,_std::hash<flow::lang::Symbol_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)(this->scope_)._M_t.
                           super___uniq_ptr_impl<flow::lang::IRGenerator::Scope,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_flow::lang::IRGenerator::Scope_*,_std::default_delete<flow::lang::IRGenerator::Scope>_>
                           .super__Head_base<0UL,_flow::lang::IRGenerator::Scope_*,_false>.
                           _M_head_impl,(key_type *)local_40);
  if ((_Var1._M_cur == (__node_type *)0x0) ||
     (value = *(Value **)((long)_Var1._M_cur + 0x10), value == (Value *)0x0)) {
    this->result_ = (Value *)0x0;
  }
  else {
    local_40._0_8_ = (key_type)(local_40 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    _Var1._M_cur = (__node_type *)
                   IRBuilder::createLoad(&this->super_IRBuilder,value,(string *)local_40);
    this->result_ = (Value *)_Var1._M_cur;
    if ((key_type)local_40._0_8_ != (key_type)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
      _Var1._M_cur = extraout_RAX;
    }
  }
  return (int)_Var1._M_cur;
}

Assistant:

void IRGenerator::accept(VariableExpr& expr) {
  // loads the value of the given variable

  if (auto var = scope().lookup(expr.variable())) {
    result_ = createLoad(var);
  } else {
    result_ = nullptr;
  }
}